

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O3

void __thiscall SharedMatting::SharedMatting(SharedMatting *this)

{
  cv::Mat::Mat(&this->pImg);
  cv::Mat::Mat(&this->trimap);
  cv::Mat::Mat(&this->matte);
  (this->ftuples).super__Vector_base<Ftuple,_std::allocator<Ftuple>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ftuples).super__Vector_base<Ftuple,_std::allocator<Ftuple>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tuples).super__Vector_base<Tuple,_std::allocator<Tuple>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tuples).super__Vector_base<Tuple,_std::allocator<Tuple>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->uT).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tuples).super__Vector_base<Tuple,_std::allocator<Tuple>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->uT).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uT).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ftuples).super__Vector_base<Ftuple,_std::allocator<Ftuple>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->kI = 10;
  this->kG = 4;
  this->kC = 5.0;
  return;
}

Assistant:

SharedMatting::SharedMatting()
{
    kI = 10;
    kC = 5.0;
    kG = 4;  
    uT.clear();
    tuples.clear();

}